

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::
int_writer<long_long,_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<long_long,_fmt::v6::basic_format_specs<char>_> *this)

{
  long *plVar1;
  char cVar2;
  locale *plVar3;
  long lVar4;
  num_writer f;
  char cVar5;
  int iVar6;
  int iVar7;
  numpunct *pnVar8;
  long *plVar9;
  uint uVar10;
  int iVar11;
  string_view prefix;
  string groups;
  locale local_60 [8];
  long *local_58;
  long local_50;
  long local_48 [2];
  ulong local_38;
  int iStack_30;
  undefined4 uStack_2c;
  long **local_28;
  char cStack_20;
  undefined7 uStack_1f;
  
  plVar3 = (locale *)(this->writer->locale_).locale_;
  if (plVar3 == (locale *)0x0) {
    std::locale::locale(local_60);
  }
  else {
    std::locale::locale(local_60,plVar3);
  }
  pnVar8 = std::use_facet<std::__cxx11::numpunct<char>>(local_60);
  (**(code **)(*(long *)pnVar8 + 0x20))(&local_58,pnVar8);
  std::locale::~locale(local_60);
  if (local_50 == 0) {
    on_dec(this);
    goto LAB_0013771c;
  }
  plVar3 = (locale *)(this->writer->locale_).locale_;
  if (plVar3 == (locale *)0x0) {
    std::locale::locale(local_60);
  }
  else {
    std::locale::locale(local_60,plVar3);
  }
  pnVar8 = std::use_facet<std::__cxx11::numpunct<char>>(local_60);
  cVar5 = (**(code **)(*(long *)pnVar8 + 0x18))(pnVar8);
  std::locale::~locale(local_60);
  if (cVar5 == '\0') {
    on_dec(this);
    goto LAB_0013771c;
  }
  local_38 = this->abs_value;
  lVar4 = 0x3f;
  if ((local_38 | 1) != 0) {
    for (; (local_38 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
    }
  }
  uVar10 = ((uint)lVar4 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  iVar11 = (uVar10 + 1) -
           (uint)(local_38 <
                 *(ulong *)(basic_data<void>::zero_or_powers_of_10_64 + (ulong)uVar10 * 8));
  plVar1 = (long *)((long)local_58 + local_50);
  plVar9 = local_58;
  iVar6 = iVar11;
  if (local_50 == 0) {
LAB_001376c4:
    iStack_30 = iVar11;
    iVar7 = iVar6;
    if (plVar9 == plVar1) goto LAB_001376ce;
  }
  else {
    iStack_30 = iVar11 + (int)local_50;
    do {
      cVar2 = (char)*plVar9;
      iVar7 = iVar6 - cVar2;
      if ((iVar7 == 0 || iVar6 < cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) goto LAB_001376c4;
      iVar11 = iVar11 + 1;
      plVar9 = (long *)((long)plVar9 + 1);
      local_50 = local_50 + -1;
      iVar6 = iVar7;
    } while (local_50 != 0);
LAB_001376ce:
    iStack_30 = (iVar7 + -1) / (int)*(char *)((long)plVar1 + -1) + iStack_30;
  }
  f._12_4_ = uStack_2c;
  f.size = iStack_30;
  f._25_7_ = uStack_1f;
  f.sep = cVar5;
  f.abs_value = local_38;
  f.groups = (string *)&local_58;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  local_28 = &local_58;
  cStack_20 = cVar5;
  basic_writer<fmt::v6::buffer_range<char>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<long_long,fmt::v6::basic_format_specs<char>>::num_writer>
            ((basic_writer<fmt::v6::buffer_range<char>> *)this->writer,iStack_30,prefix,*this->specs
             ,f);
LAB_0013771c:
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }